

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int btreeGetPage(BtShared *pBt,Pgno pgno,MemPage **ppPage,int noContent,int bReadonly)

{
  MemPage *pMVar1;
  int iVar2;
  u8 uVar3;
  DbPage *pDbPage;
  DbPage *local_20;
  
  iVar2 = sqlite3PagerAcquire(pBt->pPager,pgno,&local_20,
                              (uint)(noContent != 0) + (uint)(bReadonly != 0) * 2);
  if (iVar2 == 0) {
    pMVar1 = (MemPage *)local_20->pExtra;
    pMVar1->aData = (u8 *)local_20->pData;
    pMVar1->pDbPage = local_20;
    pMVar1->pBt = pBt;
    pMVar1->pgno = pgno;
    uVar3 = 'd';
    if (pgno != 1) {
      uVar3 = '\0';
    }
    pMVar1->hdrOffset = uVar3;
    *ppPage = pMVar1;
  }
  return iVar2;
}

Assistant:

static int btreeGetPage(
  BtShared *pBt,       /* The btree */
  Pgno pgno,           /* Number of the page to fetch */
  MemPage **ppPage,    /* Return the page in this parameter */
  int noContent,       /* Do not load page content if true */
  int bReadonly        /* True if a read-only (mmap) page is ok */
){
  int rc;
  DbPage *pDbPage;
  int flags = (noContent ? PAGER_ACQUIRE_NOCONTENT : 0) 
            | (bReadonly ? PAGER_ACQUIRE_READONLY : 0);

  assert( noContent==0 || bReadonly==0 );
  assert( sqlite3_mutex_held(pBt->mutex) );
  rc = sqlite3PagerAcquire(pBt->pPager, pgno, (DbPage**)&pDbPage, flags);
  if( rc ) return rc;
  *ppPage = btreePageFromDbPage(pDbPage, pgno, pBt);
  return SQLITE_OK;
}